

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void dgn_growths(level *lev,boolean showmsg,boolean update)

{
  boolean bVar1;
  int iVar2;
  uint waterforce;
  int herbnum;
  boolean update_local;
  boolean showmsg_local;
  level *lev_local;
  
  iVar2 = rn2(4);
  seed_tree(lev,-1,-1);
  if (herb_info[iVar2].in_water == '\0') {
    grow_herbs(herb_info[iVar2].herb,lev,-1,-1,showmsg,update);
  }
  else {
    grow_water_herbs(herb_info[iVar2].herb,lev,-1,-1);
  }
  iVar2 = rn2(0x1e);
  if (iVar2 == 0) {
    drop_ripe_treefruit(lev,-1,-1,showmsg,update);
  }
  iVar2 = rn2(8);
  bVar1 = on_level(&lev->z,&dungeon_topology.d_water_level);
  waterforce = 0x19;
  if (bVar1 != '\0') {
    waterforce = 200;
  }
  water_current(lev,-1,-1,iVar2,waterforce,showmsg,update);
  return;
}

Assistant:

void dgn_growths(struct level *lev, boolean showmsg, boolean update)
{
	int herbnum = rn2(SIZE(herb_info));
	seed_tree(lev, -1, -1);
	if (herb_info[herbnum].in_water)
	    grow_water_herbs(herb_info[herbnum].herb, lev, -1, -1);
	else
	    grow_herbs(herb_info[herbnum].herb, lev, -1, -1, showmsg, update);
	if (!rn2(30))
	    drop_ripe_treefruit(lev, -1, -1, showmsg, update);
	water_current(lev, -1, -1, rn2(8),
		      Is_waterlevel(&lev->z) ? 200 : 25, showmsg, update);
}